

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_link_complex.h
# Opt level: O3

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
::compute_link_edges
          (Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *this,Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 *parent_complex,Simplex *alpha_parent_address,bool is_alpha_blocker)

{
  _Base_ptr a;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *this_00;
  undefined4 a_00;
  undefined4 y;
  bool bVar1;
  Root_vertex_handle RVar2;
  value_type vVar3;
  Graph_vertex *pGVar4;
  _Base_ptr p_Var5;
  _Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
  _Var6;
  _Base_ptr p_Var7;
  integer_iterator<unsigned_long> iVar8;
  ulong uVar9;
  _Self __tmp;
  integer_iterator<unsigned_long> iVar10;
  Const_complex_blocker_around_vertex_range CVar11;
  undefined1 local_60 [8];
  integer_iterator<unsigned_long> local_58;
  integer_iterator<unsigned_long> local_50;
  
  if (1 < (int)(this->
               super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
               ).
               super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
               .num_vertices_) {
    Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
    ::Vertex_iterator((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       *)local_60,
                      (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       *)this);
    this_00 = (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
               *)CONCAT44(local_60._4_4_,local_60._0_4_);
    uVar9 = (ulong)this_00 ^ (ulong)this;
    Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
    ::Vertex_iterator((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       *)local_60,
                      (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       *)this);
    vVar3 = ((long)(this->
                   super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                   ).
                   super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                   .skeleton.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->
                   super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                   ).
                   super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                   .skeleton.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    iVar8.m_value = local_58.m_value;
    iVar10.m_value = local_58.m_value;
    if ((vVar3 != local_50.m_value || local_58.m_value != vVar3) || uVar9 != 0) {
LAB_00110305:
      do {
        vVar3 = iVar8.m_value + 1;
        iVar8.m_value = local_50.m_value;
        if (vVar3 != local_50.m_value) {
          pGVar4 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                   ::operator[](this_00,(Vertex_handle)(boost_vertex_handle)vVar3);
          iVar8.m_value = vVar3;
          if ((pGVar4->super_Simple_vertex).is_active_ != true) goto LAB_00110305;
        }
        Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
        ::Vertex_iterator((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                           *)local_60,
                          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                           *)this);
        vVar3 = ((long)(this->
                       super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       ).
                       super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       .skeleton.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       ).
                       super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       .skeleton.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        if ((vVar3 != local_50.m_value || iVar8.m_value != vVar3) || uVar9 != 0) {
          RVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  ::get_id((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            *)this,(boost_vertex_handle)iVar10.m_value);
          (*parent_complex->_vptr_Skeleton_blocker_complex[3])
                    ((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                      *)local_60,parent_complex,(ulong)(uint)RVar2.vertex);
          a_00 = local_60._4_4_;
          if (local_60[0] != '\0') {
            RVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                    ::get_id((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                              *)this,(boost_vertex_handle)iVar8.m_value);
            (*parent_complex->_vptr_Skeleton_blocker_complex[3])
                      ((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                        *)local_60,parent_complex,(ulong)(uint)RVar2.vertex);
            y = local_60._4_4_;
            if (local_60[0] != '\0') {
              bVar1 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                      ::contains_edge(parent_complex,(Vertex_handle)a_00,
                                      (Vertex_handle)local_60._4_4_);
              if (bVar1) {
                CVar11 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                         ::const_blocker_range(parent_complex,(Vertex_handle)a_00);
                for (_Var6._M_node =
                          (_Base_ptr)
                          CVar11.
                          super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                          .m_Begin.current_position_._M_node;
                    (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                     )_Var6._M_node !=
                    CVar11.
                    super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                    .m_End.current_position_._M_node.current_position_;
                    _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node)) {
                  a = _Var6._M_node[1]._M_parent;
                  if ((((!is_alpha_blocker) ||
                       (a[1]._M_parent !=
                        (_Base_ptr)
                        (alpha_parent_address->simplex_set)._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count)) ||
                      (bVar1 = std::__equal<false>::
                               equal<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                                         (a->_M_right,(_Base_ptr)&a->_M_parent,
                                          (alpha_parent_address->simplex_set)._M_t._M_impl.
                                          super__Rb_tree_header._M_header._M_left), !bVar1)) &&
                     (p_Var5 = a->_M_left, p_Var5 != (_Base_ptr)0x0)) {
                    p_Var7 = (_Base_ptr)&a->_M_parent;
                    do {
                      if ((int)y <= (int)p_Var5[1]._M_color) {
                        p_Var7 = p_Var5;
                      }
                      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)y];
                    } while (p_Var5 != (_Base_ptr)0x0);
                    if ((((_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)&a->_M_parent) &&
                        ((int)p_Var7[1]._M_color <= (int)y)) &&
                       (bVar1 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                ::contains_difference
                                          (alpha_parent_address,
                                           (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                            *)a,(Vertex_handle)a_00,(Vertex_handle)y), bVar1))
                    goto LAB_00110305;
                  }
                }
                Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                ::add_edge_without_blockers
                          ((Edge_handle *)local_60,
                           (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            *)this,(Vertex_handle)(boost_vertex_handle)iVar10.m_value,
                           (Vertex_handle)(boost_vertex_handle)iVar8.m_value);
              }
              goto LAB_00110305;
            }
          }
          __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                        "reference_type boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::get() [T = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle]"
                       );
        }
        do {
          iVar10.m_value = iVar10.m_value + 1;
          iVar8.m_value = local_50.m_value;
          if (local_50.m_value == iVar10.m_value) break;
          pGVar4 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                   ::operator[](this_00,(Vertex_handle)(boost_vertex_handle)iVar10.m_value);
          iVar8.m_value = iVar10.m_value;
        } while ((pGVar4->super_Simple_vertex).is_active_ != true);
        Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
        ::Vertex_iterator((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                           *)local_60,
                          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                           *)this);
        vVar3 = ((long)(this->
                       super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       ).
                       super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       .skeleton.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                       ).
                       super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                       .skeleton.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        iVar10.m_value = iVar8.m_value;
      } while ((vVar3 != local_50.m_value || iVar8.m_value != vVar3) || uVar9 != 0);
    }
  }
  return;
}

Assistant:

void compute_link_edges(const ComplexType & parent_complex,
                          const Simplex& alpha_parent_address,
                          bool is_alpha_blocker = false) {
    if (this->num_vertices() <= 1)
      return;

    for (auto x_link = this->vertex_range().begin();
         x_link != this->vertex_range().end(); ++x_link) {
      for (auto y_link = x_link; ++y_link != this->vertex_range().end();) {
        Vertex_handle x_parent = *parent_complex.get_address(
                                                             this->get_id(*x_link));
        Vertex_handle y_parent = *parent_complex.get_address(
                                                             this->get_id(*y_link));
        if (parent_complex.contains_edge(x_parent, y_parent)) {
          // we check that there is no blocker subset of alpha passing through x and y
          bool new_edge = true;
          for (auto blocker_parent : parent_complex.const_blocker_range(
                                                                        x_parent)) {
            if (!is_alpha_blocker || *blocker_parent != alpha_parent_address) {
              if (blocker_parent->contains(y_parent)) {
                new_edge = !(alpha_parent_address.contains_difference(
                                                                     *blocker_parent, x_parent, y_parent));
                if (!new_edge)
                  break;
              }
            }
          }
          if (new_edge)
            this->add_edge_without_blockers(*x_link, *y_link);
        }
      }
    }
  }